

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall GdlRenderer::DebugEngineCode(GdlRenderer *this,GrcManager *pcman,ostream *strmOut)

{
  uint32_t fxdRuleVersion;
  GdlRuleTable *pGVar1;
  ostream *poVar2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  fxdRuleVersion = GrcManager::VersionForRules(pcman);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"linebreak","");
  pGVar1 = FindRuleTable(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"substitution","");
  pGVar1 = FindRuleTable(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  if (-1 < this->m_ipassBidi) {
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS ",6);
    poVar2 = (ostream *)std::ostream::operator<<(strmOut,this->m_ipassBidi + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": bidi\n",7);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"justification","");
  pGVar1 = FindRuleTable(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"positioning","");
  pGVar1 = FindRuleTable(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  return;
}

Assistant:

void GdlRenderer::DebugEngineCode(GrcManager * pcman, std::ostream & strmOut)
{
	GdlRuleTable * prultbl;

	uint32_t fxdRuleVersion = pcman->VersionForRules();

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if (m_ipassBidi > -1)
		strmOut << "\nPASS " << m_ipassBidi + 1 << ": bidi\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
}